

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.hpp
# Opt level: O2

RealType __thiscall OpenMD::SelectionEvaluator::getVolume(SelectionEvaluator *this)

{
  if (this->hasVolume_ == true) {
    return this->volume_;
  }
  snprintf(painCave.errMsg,2000,"SelectionEvaluator Error: %s\n","No Volume For You!");
  painCave.isFatal = 1;
  painCave.severity = 1;
  simError();
  return 0.0;
}

Assistant:

RealType getVolume() {
      if (hasVolume_) {
        return volume_;
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "SelectionEvaluator Error: %s\n", "No Volume For You!");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
        return 0.0;
      }
    }